

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O3

string * __thiscall
argParserAdvancedConfiguration::buildHelpLine
          (string *__return_storage_ptr__,argParserAdvancedConfiguration *this,string *argvShort,
          string *argvLong,string *help)

{
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  long *local_68;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (argvShort->_M_string_length != 0) {
    std::operator+(&local_48,"     <",argvShort);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_58 = *plVar3;
      lStack_50 = plVar1[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar3;
      local_68 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  while (__return_storage_ptr__->_M_string_length < 0x10) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (argvLong->_M_string_length != 0) {
    std::operator+(&local_48," <",argvLong);
    puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_48);
    plVar1 = puVar2 + 2;
    if ((long *)*puVar2 == plVar1) {
      local_58 = *plVar1;
      lStack_50 = puVar2[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar1;
      local_68 = (long *)*puVar2;
    }
    *puVar2 = plVar1;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  while (__return_storage_ptr__->_M_string_length < 0x2d) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::operator+(&local_48," : ",help);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar1[3];
    plVar4 = &local_58;
  }
  else {
    local_58 = *plVar3;
    plVar4 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)plVar4);
  if (plVar4 != &local_58) {
    operator_delete(plVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string argParserAdvancedConfiguration::buildHelpLine(const string argvShort, const string argvLong, const string help) {
    string s = "";
    if (!argvShort.empty())
        s += "     <" + argvShort + ">";
    while (s.size() < 16)
        s += " ";
    if (!argvLong.empty())
        s += " <" + argvLong + "> ";
    while (s.size() < 45)
        s += " ";
    s += " : " + help + "\n";
    return s;
}